

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

IrtMapping * __thiscall
IRTreeBuildVisitor::GetTrees_abi_cxx11_(IrtMapping *__return_storage_ptr__,IRTreeBuildVisitor *this)

{
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<IRT::Statement_*,_IRT::FrameTranslator_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<IRT::Statement_*,_IRT::FrameTranslator_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,&(this->method_trees_)._M_h);
  return __return_storage_ptr__;
}

Assistant:

IrtMapping IRTreeBuildVisitor::GetTrees() { return method_trees_; }